

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_strip_flags_test.cc
# Opt level: O0

int main(int argc,char **argv)

{
  allocator local_39;
  string local_38 [32];
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Usage message",&local_39);
  gflags::SetUsageMessage((string *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  gflags::ParseCommandLineFlags((int *)&argv_local,&local_18,false);
  puts(*local_18);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  SetUsageMessage("Usage message");
  ParseCommandLineFlags(&argc, &argv, false);

  // Unfortunately, for us, libtool can replace executables with a shell
  // script that does some work before calling the 'real' executable
  // under a different name.  We need the 'real' executable name to run
  // 'strings' on it, so we construct this binary to print the real
  // name (argv[0]) on stdout when run.
  puts(argv[0]);

  return 0;
}